

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_members_pass.cpp
# Opt level: O3

void __thiscall
spvtools::opt::EliminateDeadMembersPass::MarkMembersAsLiveForExtract
          (EliminateDeadMembersPass *this,Instruction *inst)

{
  Op OVar1;
  IRContext *pIVar2;
  uint32_t uVar3;
  undefined8 in_RAX;
  Instruction *pIVar4;
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  *this_00;
  uint uVar5;
  uint uVar6;
  uint32_t member_idx;
  uint32_t local_38;
  uint local_34;
  
  local_34 = (uint)((ulong)in_RAX >> 0x20);
  if (inst->opcode_ == OpCompositeExtract) {
    uVar6 = 0;
LAB_005a0c88:
    uVar5 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar5 = (uint)inst->has_result_id_;
    }
    uVar3 = Instruction::GetSingleWordOperand(inst,uVar5 + uVar6);
    pIVar2 = (this->super_MemPass).super_Pass.context_;
    if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(pIVar2);
    }
    pIVar4 = analysis::DefUseManager::GetDef
                       ((pIVar2->def_use_mgr_)._M_t.
                        super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                        .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                        _M_head_impl,uVar3);
    uVar3 = 0;
    if (pIVar4->has_type_id_ == true) {
      uVar3 = Instruction::GetSingleWordOperand(pIVar4,0);
    }
    _local_38 = CONCAT44(local_34,uVar3);
    uVar6 = uVar6 + 1;
    uVar5 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar5 = (uint)inst->has_result_id_;
    }
    if (uVar6 < (int)((ulong)((long)(inst->operands_).
                                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(inst->operands_).
                                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 -
                uVar5) {
      do {
        pIVar2 = (this->super_MemPass).super_Pass.context_;
        if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
          IRContext::BuildDefUseManager(pIVar2);
          uVar3 = local_38;
        }
        pIVar4 = analysis::DefUseManager::GetDef
                           ((pIVar2->def_use_mgr_)._M_t.
                            super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                            .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                            _M_head_impl,uVar3);
        uVar5 = (inst->has_result_id_ & 1) + 1;
        if (inst->has_type_id_ == false) {
          uVar5 = (uint)inst->has_result_id_;
        }
        uVar3 = Instruction::GetSingleWordOperand(inst,uVar5 + uVar6);
        OVar1 = pIVar4->opcode_;
        local_34 = uVar3;
        if ((int)OVar1 < 0x1168) {
          if (OpTypeStruct < OVar1) {
LAB_005a0e2f:
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_members_pass.cpp"
                          ,0xd6,
                          "void spvtools::opt::EliminateDeadMembersPass::MarkMembersAsLiveForExtract(const Instruction *)"
                         );
          }
          if ((0x31800000U >> (OVar1 & OpTypeOpaque) & 1) != 0) goto LAB_005a0d80;
          if (OVar1 != OpTypeStruct) goto LAB_005a0e2f;
          this_00 = (_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                     *)std::__detail::
                       _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)&this->used_members_,&local_38);
          std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::_M_insert_unique<unsigned_int_const&>(this_00,&local_34);
          uVar5 = (pIVar4->has_result_id_ & 1) + 1;
          if (pIVar4->has_type_id_ == false) {
            uVar5 = (uint)pIVar4->has_result_id_;
          }
          uVar3 = uVar5 + local_34;
        }
        else {
          if (((OVar1 != OpTypeCooperativeMatrixKHR) && (OVar1 != OpTypeCooperativeVectorNV)) &&
             (OVar1 != OpTypeCooperativeMatrixNV)) goto LAB_005a0e2f;
LAB_005a0d80:
          uVar3 = (pIVar4->has_result_id_ & 1) + 1;
          if (pIVar4->has_type_id_ == false) {
            uVar3 = (uint)pIVar4->has_result_id_;
          }
        }
        uVar3 = Instruction::GetSingleWordOperand(pIVar4,uVar3);
        _local_38 = CONCAT44(local_34,uVar3);
        uVar6 = uVar6 + 1;
        uVar5 = (inst->has_result_id_ & 1) + 1;
        if (inst->has_type_id_ == false) {
          uVar5 = (uint)inst->has_result_id_;
        }
      } while (uVar6 < (int)((ulong)((long)(inst->operands_).
                                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(inst->operands_).
                                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                       -0x55555555 - uVar5);
    }
    return;
  }
  if (inst->opcode_ == OpSpecConstantOp) {
    uVar3 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar3 = (uint)inst->has_result_id_;
    }
    uVar3 = Instruction::GetSingleWordOperand(inst,uVar3);
    if (uVar3 == 0x51) {
      uVar6 = (uint)(inst->opcode_ == OpSpecConstantOp);
      goto LAB_005a0c88;
    }
  }
  __assert_fail("inst->opcode() == spv::Op::OpCompositeExtract || (inst->opcode() == spv::Op::OpSpecConstantOp && spv::Op(inst->GetSingleWordInOperand(kSpecConstOpOpcodeIdx)) == spv::Op::OpCompositeExtract)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_members_pass.cpp"
                ,0xbc,
                "void spvtools::opt::EliminateDeadMembersPass::MarkMembersAsLiveForExtract(const Instruction *)"
               );
}

Assistant:

void EliminateDeadMembersPass::MarkMembersAsLiveForExtract(
    const Instruction* inst) {
  assert(inst->opcode() == spv::Op::OpCompositeExtract ||
         (inst->opcode() == spv::Op::OpSpecConstantOp &&
          spv::Op(inst->GetSingleWordInOperand(kSpecConstOpOpcodeIdx)) ==
              spv::Op::OpCompositeExtract));

  uint32_t first_operand =
      (inst->opcode() == spv::Op::OpSpecConstantOp ? 1 : 0);
  uint32_t composite_id = inst->GetSingleWordInOperand(first_operand);
  Instruction* composite_inst = get_def_use_mgr()->GetDef(composite_id);
  uint32_t type_id = composite_inst->type_id();

  for (uint32_t i = first_operand + 1; i < inst->NumInOperands(); ++i) {
    Instruction* type_inst = get_def_use_mgr()->GetDef(type_id);
    uint32_t member_idx = inst->GetSingleWordInOperand(i);
    switch (type_inst->opcode()) {
      case spv::Op::OpTypeStruct:
        used_members_[type_id].insert(member_idx);
        type_id = type_inst->GetSingleWordInOperand(member_idx);
        break;
      case spv::Op::OpTypeArray:
      case spv::Op::OpTypeRuntimeArray:
      case spv::Op::OpTypeVector:
      case spv::Op::OpTypeMatrix:
      case spv::Op::OpTypeCooperativeMatrixNV:
      case spv::Op::OpTypeCooperativeMatrixKHR:
      case spv::Op::OpTypeCooperativeVectorNV:
        type_id = type_inst->GetSingleWordInOperand(0);
        break;
      default:
        assert(false);
    }
  }
}